

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

FT_Error T42_Driver_Init(FT_Module module)

{
  FT_Module pFVar1;
  FT_Module ttmodule;
  T42_Driver driver;
  FT_Module module_local;
  
  pFVar1 = FT_Get_Module(module->library,"truetype");
  if (pFVar1 == (FT_Module)0x0) {
    module_local._4_4_ = 0xb;
  }
  else {
    module[2].library = (FT_Library)pFVar1->clazz;
    module_local._4_4_ = 0;
  }
  return module_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Driver_Init( FT_Module  module )        /* T42_Driver */
  {
    T42_Driver  driver = (T42_Driver)module;
    FT_Module   ttmodule;


    ttmodule = FT_Get_Module( module->library, "truetype" );
    if ( !ttmodule )
    {
      FT_ERROR(( "T42_Driver_Init: cannot access `truetype' module\n" ));
      return FT_THROW( Missing_Module );
    }

    driver->ttclazz = (FT_Driver_Class)ttmodule->clazz;

    return FT_Err_Ok;
  }